

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::FixupIntersectionOrder(Clipper *this)

{
  IntersectNode **ppIVar1;
  TEdge *pTVar2;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  __first;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  __last;
  IntersectNode *pIVar3;
  long lVar4;
  pointer ppIVar5;
  TEdge *pTVar6;
  IntersectNode **ppIVar7;
  ulong uVar8;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  _Var9;
  IntersectNode *__tmp;
  value_type __val;
  IntersectNode **ppIVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t __n;
  ulong uVar15;
  __normal_iterator<ClipperLib::IntersectNode_**,_std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>_>
  __i;
  IntersectNode **ppIVar16;
  long lVar17;
  ulong uVar18;
  value_type __val_2;
  bool bVar19;
  
  pTVar2 = *(TEdge **)
            (this->_vptr_Clipper[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  this->m_SortedEdges = pTVar2;
  while (pTVar2 != (TEdge *)0x0) {
    pTVar2->PrevInSEL = pTVar2->PrevInAEL;
    pTVar2->NextInSEL = pTVar2->NextInAEL;
    pTVar2 = pTVar2->NextInAEL;
  }
  __first._M_current =
       (this->m_IntersectList).
       super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->m_IntersectList).
       super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar17 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<ClipperLib::IntersectNode**,std::vector<ClipperLib::IntersectNode*,std::allocator<ClipperLib::IntersectNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(ClipperLib::IntersectNode*,ClipperLib::IntersectNode*)>>
              (__first,__last,(ulong)(((uint)lVar17 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(ClipperLib::IntersectNode_*,_ClipperLib::IntersectNode_*)>)
               0x2dd701);
    ppIVar16 = __first._M_current + 1;
    _Var9._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      for (; ppIVar16 != __last._M_current; ppIVar16 = ppIVar16 + 1) {
        pIVar3 = *ppIVar16;
        lVar17 = (pIVar3->Pt).Y;
        if (((*__first._M_current)->Pt).Y < lVar17) {
          memmove((void *)((long)_Var9._M_current +
                          (0x10 - ((long)ppIVar16 - (long)__first._M_current))),__first._M_current,
                  (long)ppIVar16 - (long)__first._M_current);
          _Var9._M_current = __first._M_current;
        }
        else {
          lVar4 = ((*_Var9._M_current)->Pt).Y;
          _Var9._M_current = ppIVar16;
          while (lVar4 < lVar17) {
            *_Var9._M_current = _Var9._M_current[-1];
            lVar4 = (_Var9._M_current[-2]->Pt).Y;
            _Var9._M_current = _Var9._M_current + -1;
          }
        }
        *_Var9._M_current = pIVar3;
        _Var9._M_current = ppIVar16;
      }
    }
    else {
      __n = 8;
      ppIVar10 = ppIVar16;
      do {
        ppIVar1 = __first._M_current + __n;
        pIVar3 = *(IntersectNode **)((long)__first._M_current + __n);
        lVar17 = (pIVar3->Pt).Y;
        if (((*__first._M_current)->Pt).Y < lVar17) {
          memmove(ppIVar16,__first._M_current,__n);
          _Var9._M_current = __first._M_current;
        }
        else {
          lVar4 = ((*_Var9._M_current)->Pt).Y;
          _Var9._M_current = ppIVar1;
          ppIVar7 = ppIVar10;
          while (lVar4 < lVar17) {
            _Var9._M_current = ppIVar7 + -1;
            *ppIVar7 = ppIVar7[-1];
            lVar4 = (ppIVar7[-2]->Pt).Y;
            ppIVar7 = _Var9._M_current;
          }
        }
        *_Var9._M_current = pIVar3;
        __n = __n + 8;
        ppIVar10 = ppIVar10 + 1;
        _Var9._M_current = ppIVar1;
      } while (__n != 0x80);
      for (ppIVar16 = __first._M_current + 0x10; ppIVar16 != __last._M_current;
          ppIVar16 = ppIVar16 + 1) {
        pIVar3 = *ppIVar16;
        lVar17 = (pIVar3->Pt).Y;
        lVar4 = (ppIVar16[-1]->Pt).Y;
        ppIVar10 = ppIVar16;
        while (lVar4 < lVar17) {
          *ppIVar10 = ppIVar10[-1];
          lVar4 = (ppIVar10[-2]->Pt).Y;
          ppIVar10 = ppIVar10 + -1;
        }
        *ppIVar10 = pIVar3;
      }
    }
  }
  lVar17 = (long)(this->m_IntersectList).
                 super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_IntersectList).
                 super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  bVar19 = lVar17 == 0;
  if (!bVar19) {
    uVar18 = lVar17 >> 3;
    uVar8 = 1;
    uVar15 = 0;
    do {
      uVar11 = uVar8;
      if (uVar8 < uVar18) {
        uVar11 = uVar18;
      }
      ppIVar5 = (this->m_IntersectList).
                super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar3 = ppIVar5[uVar15];
      if ((pIVar3->Edge1->NextInSEL != pIVar3->Edge2) &&
         (uVar12 = uVar15, uVar14 = uVar8, pIVar3->Edge1->PrevInSEL != pIVar3->Edge2)) {
        do {
          uVar13 = uVar11;
          if (uVar18 <= uVar14) break;
          pTVar2 = ppIVar5[uVar14]->Edge1;
          pTVar6 = ppIVar5[uVar14]->Edge2;
          uVar13 = uVar14;
          if (pTVar2->NextInSEL == pTVar6) break;
          uVar13 = uVar12 + 1;
          uVar12 = uVar13;
          uVar14 = uVar14 + 1;
        } while (pTVar2->PrevInSEL != pTVar6);
        if (uVar13 == uVar18) {
          return bVar19;
        }
        ppIVar5[uVar15] = ppIVar5[uVar13];
        ppIVar5[uVar13] = pIVar3;
      }
      pIVar3 = (this->m_IntersectList).
               super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15];
      SwapPositionsInSEL(this,pIVar3->Edge1,pIVar3->Edge2);
      uVar15 = uVar15 + 1;
      bVar19 = uVar18 <= uVar15;
      uVar8 = uVar8 + 1;
    } while (uVar15 != uVar18 + (uVar18 == 0));
  }
  return bVar19;
}

Assistant:

bool Clipper::FixupIntersectionOrder()
{
  //pre-condition: intersections are sorted Bottom-most first.
  //Now it's crucial that intersections are made only between adjacent edges,
  //so to ensure this the order of intersections may need adjusting ...
  CopyAELToSEL();
  std::sort(m_IntersectList.begin(), m_IntersectList.end(), IntersectListSort);
  size_t cnt = m_IntersectList.size();
  for (size_t i = 0; i < cnt; ++i) 
  {
    if (!EdgesAdjacent(*m_IntersectList[i]))
    {
      size_t j = i + 1;
      while (j < cnt && !EdgesAdjacent(*m_IntersectList[j])) j++;
      if (j == cnt)  return false;
      std::swap(m_IntersectList[i], m_IntersectList[j]);
    }
    SwapPositionsInSEL(m_IntersectList[i]->Edge1, m_IntersectList[i]->Edge2);
  }
  return true;
}